

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_String::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,char *string,int element_count,char *mapped_string,
              int mapped_string_capacity)

{
  char *pcVar1;
  char *s1;
  char c;
  char *pcStack_28;
  int mapped_string_capacity_local;
  char *mapped_string_local;
  char *pcStack_18;
  int element_count_local;
  char *string_local;
  ON_StringMapOrdinalType map_type_local;
  
  if (mapped_string_capacity != 0) {
    if ((mapped_string == (char *)0x0) || (mapped_string_capacity < 1)) {
      return 0;
    }
    if (string != mapped_string) {
      *mapped_string = '\0';
    }
  }
  if (element_count < 0) {
    mapped_string_local._4_4_ = Length(string);
    if (mapped_string_local._4_4_ < 0) {
      return 0;
    }
    if (mapped_string_capacity == 0) {
      return mapped_string_local._4_4_ + 1;
    }
  }
  else {
    mapped_string_local._4_4_ = element_count;
    if (mapped_string_capacity == 0) {
      return element_count;
    }
  }
  if (mapped_string_capacity < mapped_string_local._4_4_) {
    return 0;
  }
  pcVar1 = string + mapped_string_local._4_4_;
  pcStack_28 = mapped_string;
  pcStack_18 = string;
  if (map_type != UpperOrdinal) {
    if (map_type == LowerOrdinal) {
      while (pcStack_18 < pcVar1) {
        s1._3_1_ = *pcStack_18;
        if (('@' < s1._3_1_) && (s1._3_1_ < '[')) {
          s1._3_1_ = s1._3_1_ + ' ';
        }
        *pcStack_28 = s1._3_1_;
        pcStack_28 = pcStack_28 + 1;
        pcStack_18 = pcStack_18 + 1;
      }
      goto LAB_008565a2;
    }
    if (map_type != MinimumOrdinal) {
      while (pcStack_18 < pcVar1) {
        *pcStack_28 = *pcStack_18;
        pcStack_28 = pcStack_28 + 1;
        pcStack_18 = pcStack_18 + 1;
      }
      goto LAB_008565a2;
    }
  }
  while (pcStack_18 < pcVar1) {
    s1._3_1_ = *pcStack_18;
    if (('`' < s1._3_1_) && (s1._3_1_ < '{')) {
      s1._3_1_ = s1._3_1_ + -0x20;
    }
    *pcStack_28 = s1._3_1_;
    pcStack_28 = pcStack_28 + 1;
    pcStack_18 = pcStack_18 + 1;
  }
LAB_008565a2:
  if (mapped_string_local._4_4_ < mapped_string_capacity) {
    *pcStack_28 = '\0';
  }
  return mapped_string_local._4_4_;
}

Assistant:

int ON_String::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  char c;
  const char* s1 = string + element_count;
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'a' && c <= 'z')
        c -= 0x20;
      *mapped_string++ = c;
    }
    break;

  case ON_StringMapOrdinalType::LowerOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'A' && c <= 'Z')
        c += 0x20;
      *mapped_string++ = c;
    }
    break;

  default:
    while (string < s1)
      *mapped_string++ = *string++;
    break;
  }

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}